

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O0

void __thiscall dynet::AdadeltaTrainer::update_params(AdadeltaTrainer *this,real gscale,size_t idx)

{
  initializer_list<dynet::Tensor_*> __l;
  vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_> *this_00;
  reference pvVar1;
  reference pvVar2;
  size_type in_RSI;
  long *in_RDI;
  undefined4 in_XMM0_Da;
  value_type *p;
  vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_> *in_stack_ffffffffffffff80;
  allocator_type *__a;
  Tensor *this_01;
  undefined1 local_38 [24];
  const_reference local_20;
  size_type local_18;
  undefined4 local_c;
  
  local_18 = in_RSI;
  local_c = in_XMM0_Da;
  this_00 = ParameterCollection::parameters_list((ParameterCollection *)0xdb2e76);
  local_20 = std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>::
             operator[](this_00,local_18);
  __a = (allocator_type *)&(*local_20)->values;
  this_01 = &(*local_20)->g;
  pvVar1 = std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>::
           operator[]((vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_> *)
                      (in_RDI + 7),local_18);
  pvVar2 = std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>::
           operator[]((vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_> *)
                      (in_RDI + 0xd),local_18);
  std::allocator<dynet::Tensor_*>::allocator((allocator<dynet::Tensor_*> *)0xdb2f16);
  __l._M_len = (size_type)pvVar2;
  __l._M_array = (iterator)pvVar1;
  std::vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>::vector
            ((vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_> *)this_01,__l,__a);
  (**(code **)(*in_RDI + 0x28))(local_c,in_RDI,local_38);
  std::vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>::~vector(in_stack_ffffffffffffff80)
  ;
  std::allocator<dynet::Tensor_*>::~allocator((allocator<dynet::Tensor_*> *)0xdb2f60);
  return;
}

Assistant:

void AdadeltaTrainer::update_params(real gscale, size_t idx) {
  auto & p = model->parameters_list()[idx];
  update_rule(gscale, {&p->values, &p->g, &hg[idx].h, &hd[idx].h});
}